

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::remove_falsified_literals(Internal *this,Clause *c)

{
  uint uVar1;
  int iVar2;
  Internal *pIVar3;
  Internal *pIVar4;
  Internal *this_00;
  size_t sVar5;
  Clause *in_RSI;
  Internal *in_RDI;
  int tmp;
  int lit;
  literal_iterator j;
  int num_non_false;
  const_literal_iterator i;
  const_literal_iterator end;
  uint in_stack_ffffffffffffffbc;
  Internal *pIVar6;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar7;
  
  pIVar3 = (Internal *)Clause::end(in_RSI);
  iVar7 = 0;
  pIVar4 = (Internal *)Clause::begin(in_RSI);
  while( true ) {
    uVar1 = in_stack_ffffffffffffffbc & 0xffffff;
    if (iVar7 < 2) {
      uVar1 = CONCAT13(pIVar4 != pIVar3,(int3)in_stack_ffffffffffffffbc);
    }
    in_stack_ffffffffffffffbc = uVar1;
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
    iVar2 = fixed(in_RDI,in_stack_ffffffffffffffbc);
    if (-1 < iVar2) {
      iVar7 = iVar7 + 1;
    }
    pIVar4 = (Internal *)&pIVar4->unsat;
  }
  if (1 < iVar7) {
    if (in_RDI->proof != (Proof *)0x0) {
      Proof::flush_clause((Proof *)pIVar4,(Clause *)CONCAT44(iVar7,in_stack_ffffffffffffffd8));
    }
    this_00 = (Internal *)Clause::begin(in_RSI);
    pIVar4 = this_00;
    for (; this_00 != pIVar3; this_00 = (Internal *)&this_00->unsat) {
      pIVar6 = (Internal *)&pIVar4->unsat;
      pIVar4->mode = this_00->mode;
      iVar2 = fixed(in_RDI,in_stack_ffffffffffffffbc);
      if (iVar2 < 0) {
        pIVar6 = (Internal *)((long)&pIVar6[-1].lits.n + 4);
      }
      pIVar4 = pIVar6;
    }
    Clause::begin(in_RSI);
    sVar5 = shrink_clause(this_00,(Clause *)CONCAT44(iVar7,in_stack_ffffffffffffffd8),
                          (int)((ulong)pIVar4 >> 0x20));
    (in_RDI->stats).collected = sVar5 + (in_RDI->stats).collected;
  }
  return;
}

Assistant:

void Internal::remove_falsified_literals (Clause *c) {
  const const_literal_iterator end = c->end ();
  const_literal_iterator i;
  int num_non_false = 0;
  for (i = c->begin (); num_non_false < 2 && i != end; i++)
    if (fixed (*i) >= 0)
      num_non_false++;
  if (num_non_false < 2)
    return;
  if (proof)
    proof->flush_clause (c);
  literal_iterator j = c->begin ();
  for (i = j; i != end; i++) {
    const int lit = *j++ = *i, tmp = fixed (lit);
    assert (tmp <= 0);
    if (tmp >= 0)
      continue;
    LOG ("flushing %d", lit);
    j--;
  }
  stats.collected += shrink_clause (c, j - c->begin ());
}